

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O0

void __thiscall pstore::command_line::option::option(option *this)

{
  const_iterator cVar1;
  option *this_local;
  
  this->_vptr_option = (_func_int **)&PTR__option_001a1c18;
  cVar1 = add_to_global_list(this);
  (this->container_pos_)._M_node = cVar1._M_node;
  std::__cxx11::string::string((string *)&this->name_);
  std::__cxx11::string::string((string *)&this->usage_);
  std::__cxx11::string::string((string *)&this->description_);
  this->occurrences_ = optional;
  this->positional_ = false;
  this->comma_separated_ = false;
  this->num_occurrences_ = 0;
  this->category_ = (option_category *)0x0;
  return;
}

Assistant:

option::option ()
                    : container_pos_{option::add_to_global_list (this)} {}